

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert_to_sampled_image_pass.cpp
# Opt level: O0

void __thiscall
spvtools::opt::ConvertToSampledImagePass::FindUsesOfImage
          (ConvertToSampledImagePass *this,Instruction *image,
          vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> *uses)

{
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> *def;
  IRContext *this_00;
  DefUseManager *this_01;
  anon_class_16_2_3ff940eb local_58;
  function<void_(spvtools::opt::Instruction_*)> local_48;
  DefUseManager *local_28;
  DefUseManager *def_use_mgr;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> *uses_local;
  Instruction *image_local;
  ConvertToSampledImagePass *this_local;
  
  def_use_mgr = (DefUseManager *)uses;
  uses_local = (vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                *)image;
  image_local = (Instruction *)this;
  this_00 = Pass::context(&this->super_Pass);
  this_01 = IRContext::get_def_use_mgr(this_00);
  def = uses_local;
  local_58.uses =
       (vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> *)
       def_use_mgr;
  local_58.this = this;
  local_28 = this_01;
  std::function<void(spvtools::opt::Instruction*)>::
  function<spvtools::opt::ConvertToSampledImagePass::FindUsesOfImage(spvtools::opt::Instruction_const*,std::vector<spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>>*)const::__0,void>
            ((function<void(spvtools::opt::Instruction*)> *)&local_48,&local_58);
  analysis::DefUseManager::ForEachUser(this_01,(Instruction *)def,&local_48);
  std::function<void_(spvtools::opt::Instruction_*)>::~function(&local_48);
  return;
}

Assistant:

void ConvertToSampledImagePass::FindUsesOfImage(
    const Instruction* image, std::vector<Instruction*>* uses) const {
  auto* def_use_mgr = context()->get_def_use_mgr();
  def_use_mgr->ForEachUser(image, [uses, this](Instruction* user) {
    switch (user->opcode()) {
      case spv::Op::OpImageFetch:
      case spv::Op::OpImageRead:
      case spv::Op::OpImageWrite:
      case spv::Op::OpImageQueryFormat:
      case spv::Op::OpImageQueryOrder:
      case spv::Op::OpImageQuerySizeLod:
      case spv::Op::OpImageQuerySize:
      case spv::Op::OpImageQueryLevels:
      case spv::Op::OpImageQuerySamples:
      case spv::Op::OpImageSparseFetch:
        uses->push_back(user);
      default:
        break;
    }
    if (user->opcode() == spv::Op::OpCopyObject) {
      FindUsesOfImage(user, uses);
    }
  });
}